

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::Bt3Zip_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit_00;
  Byte *pBVar1;
  uint uVar2;
  UInt32 UVar3;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hashValue;
  UInt32 lenLimit;
  UInt32 num_local;
  CMatchFinder *p_local;
  
  hashValue = num;
  do {
    lenLimit_00 = p->lenLimit;
    if (lenLimit_00 < 3) {
      MatchFinder_MovePos(p);
    }
    else {
      pBVar1 = p->buffer;
      uVar2 = ((uint)CONCAT11(*pBVar1,pBVar1[2]) ^ p->crc[pBVar1[1]]) & 0xffff;
      UVar3 = p->hash[uVar2];
      p->hash[uVar2] = p->pos;
      SkipMatchesSpec(lenLimit_00,UVar3,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                      p->cyclicBufferSize,p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar3 = p->pos + 1;
      p->pos = UVar3;
      if (UVar3 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    hashValue = hashValue - 1;
  } while (hashValue != 0);
  return;
}

Assistant:

void Bt3Zip_MatchFinder_Skip(CMatchFinder* p, UInt32 num) {
  do {
    SKIP_HEADER(3)
    HASH_ZIP_CALC;
    curMatch = p->hash[hashValue];
    p->hash[hashValue] = p->pos;
    SKIP_FOOTER
  } while (--num != 0);
}